

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zetMetricTracerEnableExp(zet_metric_tracer_exp_handle_t hMetricTracer,ze_bool_t synchronous)

{
  ze_result_t zVar1;
  
  if (DAT_0010e760 != (code *)0x0) {
    zVar1 = (*DAT_0010e760)(hMetricTracer,synchronous);
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerEnableExp(
        zet_metric_tracer_exp_handle_t hMetricTracer,   ///< [in] handle of the metric tracer
        ze_bool_t synchronous                           ///< [in] request synchronous behavior. Confirmation of successful
                                                        ///< asynchronous operation is done by calling ::zetMetricTracerReadDataExp()
                                                        ///< and checking the return status: ::ZE_RESULT_NOT_READY will be returned
                                                        ///< when the tracer is inactive. ::ZE_RESULT_SUCCESS will be returned 
                                                        ///< when the tracer is active.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEnableExp = context.zetDdiTable.MetricTracerExp.pfnEnableExp;
        if( nullptr != pfnEnableExp )
        {
            result = pfnEnableExp( hMetricTracer, synchronous );
        }
        else
        {
            // generic implementation
        }

        return result;
    }